

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O3

bool __thiscall MeCab::Connector::openText(Connector *this,char *filename)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  size_t sVar5;
  char *__s;
  ulong uVar6;
  ostream *poVar7;
  char *pcVar8;
  char **ppcVar9;
  whatlog *pwVar10;
  char *pcVar11;
  char *pcVar12;
  char *column [2];
  ifstream ifs;
  undefined1 auStack_248 [15];
  die local_239;
  char *local_238 [2];
  long local_228 [4];
  uint auStack_208 [122];
  
  std::ifstream::ifstream(local_228,filename,_S_in);
  lVar2 = *(long *)(local_228[0] + -0x18);
  uVar1 = *(uint *)((long)auStack_208 + lVar2);
  if ((uVar1 & 5) == 0) {
    __s = (char *)operator_new__(0x2000);
    std::ios::widen((char)auStack_248 + (char)lVar2 + ' ');
    std::istream::getline((char *)local_228,(long)__s,'\0');
    sVar5 = strlen(__s);
    pcVar8 = __s + sVar5;
    ppcVar9 = local_238;
    uVar6 = 0;
    pcVar11 = __s;
    do {
      pcVar3 = pcVar11;
      if (1 < uVar6) break;
      for (; ((pcVar12 = pcVar8, pcVar3 != pcVar8 && (pcVar12 = pcVar3, *pcVar3 != '\t')) &&
             (*pcVar3 != ' ')); pcVar3 = pcVar3 + 1) {
      }
      *pcVar12 = '\0';
      if (*pcVar11 != '\0') {
        *ppcVar9 = pcVar11;
        ppcVar9 = ppcVar9 + 1;
        uVar6 = uVar6 + 1;
      }
      pcVar11 = pcVar12 + 1;
    } while (pcVar12 != pcVar8);
    if (uVar6 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x39);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"tokenize2(buf.get(), \"\\t \", column, 2) == 2",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"format error: ",0xe);
      sVar5 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar5);
      die::~die(&local_239);
    }
    iVar4 = atoi(local_238[0]);
    this->lsize_ = (unsigned_short)iVar4;
    iVar4 = atoi(local_238[1]);
    this->rsize_ = (unsigned_short)iVar4;
    operator_delete__(__s);
  }
  else {
    pwVar10 = &this->what_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pwVar10,"no such file or directory: ",0x1b);
    if (filename == (char *)0x0) {
      std::ios::clear((int)pwVar10 + (int)*(undefined8 *)(*(long *)pwVar10 + -0x18));
    }
    else {
      sVar5 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar10,filename,sVar5);
    }
  }
  std::ifstream::~ifstream(local_228);
  return (uVar1 & 5) == 0;
}

Assistant:

bool Connector::openText(const char *filename) {
  std::ifstream ifs(WPATH(filename));
  if (!ifs) {
    WHAT << "no such file or directory: " << filename;
    return false;
  }
  char *column[2];
  scoped_fixed_array<char, BUF_SIZE> buf;
  ifs.getline(buf.get(), buf.size());
  CHECK_DIE(tokenize2(buf.get(), "\t ", column, 2) == 2)
      << "format error: " << buf.get();
  lsize_ = std::atoi(column[0]);
  rsize_ = std::atoi(column[1]);
  return true;
}